

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

string * cs_impl::file_system::get_current_dir_abi_cxx11_(void)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  runtime_error *prVar4;
  string *in_RDI;
  stringstream str;
  char temp [4096];
  string local_11c0;
  undefined1 local_11a0 [392];
  char local_1018 [4096];
  
  memset(local_1018,0,0x1000);
  pcVar2 = getcwd(local_1018,0x1000);
  if (pcVar2 != (char *)0x0) {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    strlen(local_1018);
    std::__cxx11::string::_M_construct<char_const*>();
    return in_RDI;
  }
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  if (iVar1 != 0xc) {
    if (iVar1 == 0xd) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x28);
      local_11a0._0_8_ = local_11a0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_11a0,"Permission denied","");
      cs::runtime_error::runtime_error(prVar4,(string *)local_11a0);
      __cxa_throw(prVar4,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_11a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_11a0 + 0x10),"Unrecognised errno: ",0x14);
    std::ostream::operator<<((ostream *)(local_11a0 + 0x10),iVar1);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    cs::runtime_error::runtime_error(prVar4,&local_11c0);
    __cxa_throw(prVar4,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x28);
  local_11a0._0_8_ = local_11a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_11a0,"Out of memory","");
  cs::runtime_error::runtime_error(prVar4,(string *)local_11a0);
  __cxa_throw(prVar4,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
}

Assistant:

std::string get_current_dir()
		{
			char temp[PATH_MAX] = "";

			if (::getcwd(temp, PATH_MAX) != nullptr) {
				return std::string(temp);
			}

			int error = errno;
			switch (error) {
			case EACCES:
				throw cs::runtime_error("Permission denied");

			case ENOMEM:
				throw cs::runtime_error("Out of memory");

			default: {
				std::stringstream str;
				str << "Unrecognised errno: " << error;
				throw cs::runtime_error(str.str());
			}
			}
		}